

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall
CppGenerator::registerDependentComputationToLoops(CppGenerator *this,size_t depth,size_t group_id)

{
  prod_bitset presentFunctions_00;
  bool bVar1;
  reference this_00;
  TDNode *pTVar2;
  reference puVar3;
  long lVar4;
  size_type in_RDX;
  long in_RSI;
  undefined8 *puVar5;
  long in_RDI;
  undefined8 *puVar6;
  byte bVar7;
  pair<unsigned_long,_unsigned_long> *in_stack_00000068;
  size_t *in_stack_00000070;
  size_t *in_stack_00000078;
  size_t in_stack_00000080;
  ProductAggregate *in_stack_00000088;
  CppGenerator *in_stack_00000090;
  pair<unsigned_long,_unsigned_long> prevAgg;
  size_t currentLoop;
  ProductAggregate *prodAgg;
  AggregateTuple *depAgg_1;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  size_t viewID_1;
  iterator __end1_1;
  iterator __begin1_1;
  value_type *__range1_1;
  pair<unsigned_long,_unsigned_long> *p;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range4;
  AggregateTuple *depAgg;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  dyn_bitset addedOutLoops;
  dyn_bitset contributingViews;
  prod_bitset presentFunctions;
  size_t viewID;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  DependentLoop depLoop;
  CppGenerator *in_stack_000006b0;
  _Base_bitset<2UL> in_stack_000006b8;
  dyn_bitset consideredLoops;
  var_bitset *relationBag;
  size_t maxDepth;
  var_bitset *varOrderBitset;
  undefined1 in_stack_00000718 [120];
  _Base_bitset<2UL> in_stack_00000790;
  dyn_bitset *in_stack_000007a0;
  size_t in_stack_000007a8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff8e8;
  undefined7 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f7;
  value_type *in_stack_fffffffffffff8f8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff900;
  size_type in_stack_fffffffffffff908;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff910;
  size_t in_stack_fffffffffffff918;
  DependentLoop *in_stack_fffffffffffff920;
  int local_564;
  size_type local_560;
  pair<unsigned_long,_unsigned_long> local_558;
  undefined8 local_548;
  ProductAggregate *local_540;
  reference local_538;
  AggregateTuple *local_530;
  __normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
  local_528;
  reference local_520;
  size_type local_518;
  unsigned_long *local_510;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_508;
  reference local_500;
  _WordT local_418;
  _WordT _Stack_410;
  _WordT local_3e8;
  _WordT _Stack_3e0;
  undefined8 local_3d0 [24];
  reference local_310;
  pair<unsigned_long,_unsigned_long> *local_308;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_300;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *local_2f8;
  reference local_2f0;
  AggregateTuple *local_2e8;
  __normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
  local_2e0;
  reference local_2d8;
  undefined1 local_280 [192];
  unsigned_long local_1c0;
  unsigned_long *local_1b8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1b0;
  reference local_1a8;
  size_t local_130;
  bitset<100UL> *local_30;
  size_type local_28;
  reference local_20;
  size_type local_18;
  long local_10;
  
  bVar7 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                       ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                        (in_RDI + 0xd0),in_RDX);
  local_28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (*(long *)(in_RDI + 0xb8) + local_18 * 0x18));
  std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2caaeb);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2cab0c);
  this_00 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)(in_RDI + 0xf0),local_18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,0);
  QueryCompiler::getView
            ((QueryCompiler *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
             (size_t)in_stack_fffffffffffff8e8);
  pTVar2 = TreeDecomposition::getRelation
                     ((TreeDecomposition *)
                      CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                      (size_t)in_stack_fffffffffffff8e8);
  local_30 = &pTVar2->_bag;
  std::vector<DependentLoop,_std::allocator<DependentLoop>_>::clear
            ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)0x2cab86);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2cab93);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2cab9b);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2cabbb);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908,
             (unsigned_long)in_stack_fffffffffffff900,
             (allocator<unsigned_long> *)in_stack_fffffffffffff8f8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2cabef);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2cac00);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2cac08);
  DependentLoop::DependentLoop(in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),in_stack_fffffffffffff8e8
            );
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2cac51);
  local_130 = QueryCompiler::numberOfViews((QueryCompiler *)0x2cac59);
  std::vector<DependentLoop,_std::allocator<DependentLoop>_>::push_back
            ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)in_stack_fffffffffffff900,
             in_stack_fffffffffffff8f8);
  local_1a8 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)(in_RDI + 0xf0),local_18);
  local_1b0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 (&in_stack_fffffffffffff8e8->m_bits);
  local_1b8 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        (&in_stack_fffffffffffff8e8->m_bits);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffff8e8), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_1b0);
    local_1c0 = *puVar3;
    if (*(long *)(*(long *)(in_RDI + 0xb0) + local_1c0 * 8) == local_10) {
      std::bitset<1500UL>::bitset((bitset<1500UL> *)0x2cad4e);
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2cad5f);
      QueryCompiler::numberOfViews((QueryCompiler *)0x2cad67);
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2cad99);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                 (unsigned_long)in_stack_fffffffffffff900,
                 (allocator<unsigned_long> *)in_stack_fffffffffffff8f8);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2cadc9);
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2cadda);
      QueryCompiler::numberOfViews((QueryCompiler *)0x2cade2);
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2cae14);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                 (unsigned_long)in_stack_fffffffffffff900,
                 (allocator<unsigned_long> *)in_stack_fffffffffffff8f8);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2cae44);
      local_2d8 = std::
                  vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                                *)(in_RDI + 0x520),local_1c0);
      local_2e0._M_current =
           (AggregateTuple *)
           std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::begin
                     ((vector<AggregateTuple,_std::allocator<AggregateTuple>_> *)
                      in_stack_fffffffffffff8e8);
      local_2e8 = (AggregateTuple *)
                  std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::end
                            ((vector<AggregateTuple,_std::allocator<AggregateTuple>_> *)
                             in_stack_fffffffffffff8e8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                                (__normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
                                 *)in_stack_fffffffffffff8e8), bVar1) {
        local_2f0 = __gnu_cxx::
                    __normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
                    ::operator*(&local_2e0);
        std::bitset<1500UL>::operator|=
                  ((bitset<1500UL> *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                   (bitset<1500UL> *)in_stack_fffffffffffff8e8);
        local_2f8 = &(local_2f0->dependentProdAgg).viewAggregate;
        local_300._M_current =
             (pair<unsigned_long,_unsigned_long> *)
             std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)in_stack_fffffffffffff8e8);
        local_308 = (pair<unsigned_long,_unsigned_long> *)
                    std::
                    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           *)in_stack_fffffffffffff8e8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                                  (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                   *)in_stack_fffffffffffff8e8), bVar1) {
          local_310 = __gnu_cxx::
                      __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                      ::operator*(&local_300);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                    (in_stack_fffffffffffff900,(size_type)in_stack_fffffffffffff8f8,
                     (bool)in_stack_fffffffffffff8f7);
          __gnu_cxx::
          __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::operator++(&local_300);
        }
        __gnu_cxx::
        __normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
        ::operator++(&local_2e0);
      }
      memcpy(local_3d0,local_280,0xc0);
      local_3e8 = (local_30->super__Base_bitset<2UL>)._M_w[0];
      _Stack_3e0 = (local_30->super__Base_bitset<2UL>)._M_w[1];
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                 in_stack_fffffffffffff8e8);
      local_418 = (local_20->super__Base_bitset<2UL>)._M_w[0];
      _Stack_410 = (local_20->super__Base_bitset<2UL>)._M_w[1];
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                 in_stack_fffffffffffff8e8);
      puVar5 = local_3d0;
      puVar6 = (undefined8 *)&stack0xfffffffffffff8e8;
      for (lVar4 = 0x18; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar6 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
        puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
      }
      presentFunctions_00.super__Base_bitset<24UL>._M_w[6] = group_id;
      presentFunctions_00.super__Base_bitset<24UL>._M_w._0_48_ = stack0x000006d0;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[7] = depth;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[8] = (_WordT)this;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[9] = in_stack_00000718._0_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[10] = in_stack_00000718._8_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0xb] = in_stack_00000718._16_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0xc] = in_stack_00000718._24_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0xd] = in_stack_00000718._32_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0xe] = in_stack_00000718._40_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0xf] = in_stack_00000718._48_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0x10] = in_stack_00000718._56_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0x11] = in_stack_00000718._64_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0x12] = in_stack_00000718._72_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0x13] = in_stack_00000718._80_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0x14] = in_stack_00000718._88_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0x15] = in_stack_00000718._96_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0x16] = in_stack_00000718._104_8_;
      presentFunctions_00.super__Base_bitset<24UL>._M_w[0x17] = in_stack_00000718._112_8_;
      computeDependentLoops
                (in_stack_000006b0,depLoop.branchFunctions.super__Base_bitset<24UL>._M_w[0x17],
                 presentFunctions_00,(var_bitset)in_stack_000006b8._M_w,
                 (dyn_bitset *)depLoop.branchFunctions.super__Base_bitset<24UL>._M_w[0x16],
                 (var_bitset)in_stack_00000790._M_w,in_stack_000007a0,in_stack_000007a8);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2cb185);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2cb192);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2cb19f);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2cb1ac);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_1b0);
  }
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::clear((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
           *)0x2cb241);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::clear((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
           *)0x2cb255);
  std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
            ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RDI + 0x5c8));
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::resize((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
            *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
            ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RDI + 0x5c8));
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::resize((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
            *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::clear((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
           *)0x2cb2ce);
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::clear((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
           *)0x2cb2e2);
  std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
            ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RDI + 0x5c8));
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::resize((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
            *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
            ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)(in_RDI + 0x5c8));
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::resize((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
            *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_500 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)(in_RDI + 0xf0),local_18);
  local_508._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 (&in_stack_fffffffffffff8e8->m_bits);
  local_510 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        (&in_stack_fffffffffffff8e8->m_bits);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffff8e8), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_508);
    local_518 = *puVar3;
    if (*(long *)(*(long *)(in_RDI + 0xb0) + local_518 * 8) == local_10) {
      local_520 = std::
                  vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                  ::operator[]((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                                *)(in_RDI + 0x520),local_518);
      local_528._M_current =
           (AggregateTuple *)
           std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::begin
                     ((vector<AggregateTuple,_std::allocator<AggregateTuple>_> *)
                      in_stack_fffffffffffff8e8);
      local_530 = (AggregateTuple *)
                  std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::end
                            ((vector<AggregateTuple,_std::allocator<AggregateTuple>_> *)
                             in_stack_fffffffffffff8e8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                                (__normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
                                 *)in_stack_fffffffffffff8e8), bVar1) {
        local_538 = __gnu_cxx::
                    __normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
                    ::operator*(&local_528);
        local_540 = &local_538->dependentProdAgg;
        local_548 = 0;
        local_560 = std::vector<DependentLoop,_std::allocator<DependentLoop>_>::size
                              ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)
                               (in_RDI + 0x5c8));
        local_564 = 0;
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
                  (&local_558,&local_560,&local_564);
        addDependentProductToLoop
                  (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                   in_stack_00000070,in_stack_00000068);
        std::pair<unsigned_long,_unsigned_long>::operator=
                  (&local_540->correspondingLoopAgg,&local_558);
        __gnu_cxx::
        __normal_iterator<AggregateTuple_*,_std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>
        ::operator++(&local_528);
      }
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_508);
  }
  DependentLoop::~DependentLoop
            ((DependentLoop *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2cb5a1);
  return;
}

Assistant:

void CppGenerator::registerDependentComputationToLoops(size_t depth, size_t group_id)
{
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    const size_t maxDepth = groupVariableOrder[group_id].size();
    const var_bitset& relationBag =
        _td->getRelation(_qc->getView(viewGroups[group_id][0])->_origin)->_bag;

    depListOfLoops.clear();


    dyn_bitset consideredLoops(_qc->numberOfViews()+1);

    // add empty loop to the list of dependentLoops
    DependentLoop depLoop(_qc->numberOfViews());
    depLoop.loopFactors = consideredLoops;
    depLoop.loopVariable = _qc->numberOfViews();
    
    depListOfLoops.push_back(depLoop);

    // Go over each view that can be outputted at this depth 
    for (const size_t viewID : viewGroups[group_id])
    {
        if (viewLevelRegister[viewID] == depth)
        {
            // go through the ProductAggregates and find functions computed here 
            prod_bitset presentFunctions;
            dyn_bitset contributingViews(_qc->numberOfViews()+1);
            dyn_bitset addedOutLoops(_qc->numberOfViews()+1);

            // Check for all aggregates of that view what dependent computation
            // it requires
            for (const AggregateTuple& depAgg : aggregateComputation[viewID])
            {
                presentFunctions |= depAgg.dependentProdAgg.product;
                for (const auto& p : depAgg.dependentProdAgg.viewAggregate)
                    contributingViews.set(p.first);
            }

            
            // Compute the loops for the dependent computation of this
            // output view
            computeDependentLoops(viewID,presentFunctions,relationBag,contributingViews,
                                  varOrderBitset,addedOutLoops,0);
        }
    }

    // reset the List and Maps for aggregates
    localProductList.clear();
    localProductMap.clear();
    localProductList.resize(depListOfLoops.size());
    localProductMap.resize(depListOfLoops.size());
    
    newAggregateRegister.clear();
    aggregateRegisterMap.clear();
    newAggregateRegister.resize(depListOfLoops.size());
    aggregateRegisterMap.resize(depListOfLoops.size());


    // add the aggregates needed for views outputted at this level to the loops
    for (const size_t viewID : viewGroups[group_id])
    {
        if (viewLevelRegister[viewID] == depth)
        {
            for (AggregateTuple& depAgg : aggregateComputation[viewID])
            {
                ProductAggregate& prodAgg = depAgg.dependentProdAgg;

                size_t currentLoop = 0;
                std::pair<size_t, size_t> prevAgg = {depListOfLoops.size(), 0};
                
                addDependentProductToLoop(
                    prodAgg, viewID, currentLoop, maxDepth, prevAgg);

                prodAgg.correspondingLoopAgg = prevAgg;
            }
        }
    }
}